

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int mbedtls_cipher_crypt
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *input,size_t ilen,
              uchar *output,size_t *olen)

{
  mbedtls_cipher_info_t *pmVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  size_t local_30;
  
  iVar3 = -0x6100;
  if ((ctx != (mbedtls_cipher_context_t *)0x0) &&
     (pmVar1 = ctx->cipher_info, iv != (uchar *)0x0 && pmVar1 != (mbedtls_cipher_info_t *)0x0)) {
    if (iv_len < 0x11) {
      __n = iv_len;
      if (((pmVar1->flags & 1) != 0) || (__n = (size_t)pmVar1->iv_size, __n <= iv_len)) {
        memcpy(ctx->iv,iv,__n);
        ctx->iv_size = __n;
        iVar3 = 0;
        bVar2 = true;
        goto LAB_00106ee0;
      }
    }
    else {
      iVar3 = -0x6080;
    }
  }
  bVar2 = false;
LAB_00106ee0:
  if (bVar2) {
    iVar3 = -0x6100;
    bVar2 = false;
    if ((ctx != (mbedtls_cipher_context_t *)0x0) &&
       (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) {
      ctx->unprocessed_len = 0;
      bVar2 = true;
      iVar3 = 0;
    }
    if (bVar2) {
      iVar3 = mbedtls_cipher_update(ctx,input,ilen,output,olen);
      if (iVar3 == 0) {
        iVar3 = mbedtls_cipher_finish(ctx,output + *olen,&local_30);
        if (iVar3 == 0) {
          *olen = *olen + local_30;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_cipher_crypt( mbedtls_cipher_context_t *ctx,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *input, size_t ilen,
                  unsigned char *output, size_t *olen )
{
    int ret;
    size_t finish_olen;

    if( ( ret = mbedtls_cipher_set_iv( ctx, iv, iv_len ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_reset( ctx ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_update( ctx, input, ilen, output, olen ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_finish( ctx, output + *olen, &finish_olen ) ) != 0 )
        return( ret );

    *olen += finish_olen;

    return( 0 );
}